

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O1

void duckdb::
     HistogramBinUpdateFunction<duckdb::HistogramGenericFunctor,duckdb::string_t,duckdb::HistogramRange>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  data_ptr_t pdVar1;
  long *plVar2;
  HistogramBinState<duckdb::string_t> *this;
  unsafe_vector<duckdb::string_t> *puVar3;
  idx_t iVar4;
  __normal_iterator<const_duckdb::string_t_*,_std::vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>_>
  _Var5;
  idx_t pos;
  idx_t iVar6;
  UnifiedVectorFormat input_data;
  UnifiedVectorFormat sdata;
  Vector extra_state;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  UnifiedVectorFormat local_128;
  UnifiedVectorFormat local_e0;
  Vector local_98;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
  Vector::ToUnifiedFormat(state_vector,count,&local_e0);
  HistogramGenericFunctor::CreateExtraState(&local_98,count);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_128);
  HistogramGenericFunctor::PrepareData(inputs,count,&local_98,&local_128);
  if (count != 0) {
    pos = 0;
    do {
      iVar6 = pos;
      if ((local_128.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(local_128.sel)->sel_vector[pos];
      }
      if ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar6 >> 6]
           >> (iVar6 & 0x3f) & 1) != 0)) {
        iVar4 = pos;
        if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
          iVar4 = (idx_t)(local_e0.sel)->sel_vector[pos];
        }
        this = *(HistogramBinState<duckdb::string_t> **)(local_e0.data + iVar4 * 8);
        if (this->bin_boundaries == (unsafe_vector<duckdb::string_t> *)0x0) {
          HistogramBinState<duckdb::string_t>::InitializeBins<duckdb::HistogramGenericFunctor>
                    (this,inputs + 1,count,pos,aggr_input);
        }
        pdVar1 = local_128.data + iVar6 * 0x10;
        local_138 = *(undefined4 *)pdVar1;
        uStack_134 = *(undefined4 *)(pdVar1 + 4);
        uStack_130 = *(undefined4 *)(pdVar1 + 8);
        uStack_12c = *(undefined4 *)(pdVar1 + 0xc);
        puVar3 = this->bin_boundaries;
        _Var5 = ::std::
                __lower_bound<__gnu_cxx::__normal_iterator<duckdb::string_t_const*,std::vector<duckdb::string_t,std::allocator<duckdb::string_t>>>,duckdb::string_t,__gnu_cxx::__ops::_Iter_less_val>
                          ((puVar3->
                           super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
                           super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                           (puVar3->
                           super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
                           super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_138);
        plVar2 = (long *)((long)(this->counts->
                                super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start +
                         ((long)_Var5._M_current -
                          (long)(puVar3->
                                super_vector<duckdb::string_t,_std::allocator<duckdb::string_t>_>).
                                super__Vector_base<duckdb::string_t,_std::allocator<duckdb::string_t>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 1));
        *plVar2 = *plVar2 + 1;
      }
      pos = pos + 1;
    } while (count != pos);
  }
  if (local_128.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  if (local_e0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void HistogramBinUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                       Vector &state_vector, idx_t count) {
	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto &bin_vector = inputs[1];

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);
	auto data = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.IsSet()) {
			state.template InitializeBins<OP>(bin_vector, count, i, aggr_input);
		}
		auto bin_entry = HIST::template GetBin<T>(data[idx], *state.bin_boundaries);
		++(*state.counts)[bin_entry];
	}
}